

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3Floor_Test::TestBody(VectorsTest_FP3Floor_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Vector3<int> VVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FP3 v;
  AssertHelper *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  int *expected;
  char *in_stack_fffffffffffffe80;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int line;
  Vector3<double> *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Type TVar3;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult *this_02;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 uVar4;
  Vector3<int> local_114;
  Vector3<int> local_108;
  undefined8 local_f8;
  int local_f0 [2];
  AssertionResult local_e8 [2];
  Vector3<int> local_c4;
  Vector3<int> local_b8;
  undefined8 local_a8;
  int local_a0;
  AssertionResult local_98;
  uint local_84;
  Vector3<int> local_5c;
  Vector3<int> local_50;
  undefined8 local_40;
  int local_38;
  AssertionResult local_30;
  Vector3<double> local_20;
  
  TVar3 = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  pica::Vector3<double>::Vector3(&local_20,5.2,7.5,-1.4);
  VVar2 = pica::floor<double>(in_stack_fffffffffffffe90);
  local_50.z = VVar2.z;
  local_38 = local_50.z;
  local_50._0_8_ = VVar2._0_8_;
  local_40._0_4_ = local_50.x;
  local_40._4_4_ = local_50.y;
  local_50 = VVar2;
  pica::Vector3<int>::Vector3(&local_5c,5,7,-2);
  this_03 = &local_30;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  uVar4 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1e9512);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,TVar3,(char *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffed0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x1e956f);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e95dd);
  if (local_84 == 0) {
    VVar2 = pica::floor<double>(in_stack_fffffffffffffe90);
    local_b8.z = VVar2.z;
    local_a0 = local_b8.z;
    local_b8._0_8_ = VVar2._0_8_;
    local_a8._0_4_ = local_b8.x;
    local_a8._4_4_ = local_b8.y;
    TVar3 = (Type)((ulong)((long)&local_a8 + 4) >> 0x20);
    local_b8 = VVar2;
    pica::Vector3<int>::Vector3(&local_c4,5,7,-2);
    this_02 = &local_98;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_fffffffffffffe90 =
           (Vector3<double> *)testing::AssertionResult::failure_message((AssertionResult *)0x1e96e5)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,TVar3,(char *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffed0),(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x1e9742);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e97b0);
    if (local_84 == 0) {
      VVar2 = pica::floor<double>(in_stack_fffffffffffffe90);
      local_108.z = VVar2.z;
      local_f0[0] = local_108.z;
      local_108._0_8_ = VVar2._0_8_;
      local_f8._0_4_ = local_108.x;
      local_f8._4_4_ = local_108.y;
      expected = local_f0;
      local_108 = VVar2;
      pica::Vector3<int>::Vector3(&local_114,5,7,-2);
      this_01 = local_e8;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 &this_01->success_,expected,(int *)in_stack_fffffffffffffe70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
      if (!bVar1) {
        testing::Message::Message((Message *)this_02);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x1e98b5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_02,TVar3,(char *)in_stack_fffffffffffffe90,line,
                   &this_01->success_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffed0),(Message *)this_03);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1e9903);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e9968);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3Floor)
{
    FP3 v(5.2, 7.5, -1.4);
    ASSERT_EQ_INT3(floor(v), Int3(5, 7, -2));
}